

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

BufferSp __thiscall
vkt::SpirVAssembly::getBuffer(SpirVAssembly *this,IntegerType type,deInt64 number)

{
  Buffer<int> *this_00;
  SharedPtrStateBase *pSVar1;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar2;
  allocator_type local_35;
  value_type_conflict4 local_34;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  switch(type) {
  case INTEGER_TYPE_SIGNED_16:
    BVar2 = getSpecializedBuffer<short>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_SIGNED_32:
    BVar2 = getSpecializedBuffer<int>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_SIGNED_64:
    BVar2 = getSpecializedBuffer<long>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_16:
    BVar2 = getSpecializedBuffer<unsigned_short>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_32:
    BVar2 = getSpecializedBuffer<unsigned_int>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  case INTEGER_TYPE_UNSIGNED_64:
    BVar2 = getSpecializedBuffer<unsigned_long>(this,number);
    pSVar1 = BVar2.m_state;
    break;
  default:
    this_00 = (Buffer<int> *)operator_new(0x20);
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_30,1,&local_34,&local_35);
    Buffer<int>::Buffer(this_00,(vector<int,_std::allocator<int>_> *)&local_30);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
    pSVar1 = extraout_RDX;
  }
  BVar2.m_state = pSVar1;
  BVar2.m_ptr = (BufferInterface *)this;
  return BVar2;
}

Assistant:

BufferSp getBuffer (IntegerType type, deInt64 number)
{
	switch (type)
	{
		case INTEGER_TYPE_SIGNED_16:	return getSpecializedBuffer<deInt16>(number);
		case INTEGER_TYPE_SIGNED_32:	return getSpecializedBuffer<deInt32>(number);
		case INTEGER_TYPE_SIGNED_64:	return getSpecializedBuffer<deInt64>(number);

		case INTEGER_TYPE_UNSIGNED_16:	return getSpecializedBuffer<deUint16>(number);
		case INTEGER_TYPE_UNSIGNED_32:	return getSpecializedBuffer<deUint32>(number);
		case INTEGER_TYPE_UNSIGNED_64:	return getSpecializedBuffer<deUint64>(number);

		default:						DE_ASSERT(false);
										return BufferSp(new Buffer<deInt32>(vector<deInt32>(1, 0)));
	}
}